

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

uint __thiscall llvm::APInt::countTrailingZerosSlowCase(APInt *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong *puVar7;
  
  uVar1 = this->BitWidth;
  puVar7 = (this->U).pVal;
  uVar4 = (uint)((ulong)uVar1 + 0x3f) & 0xffffffc0;
  lVar6 = 0;
  while( true ) {
    if (((ulong)uVar1 + 0x3f & 0xffffffffffffffc0) + lVar6 == 0) goto LAB_0013bed7;
    if (*puVar7 != 0) break;
    puVar7 = puVar7 + 1;
    lVar6 = lVar6 + -0x40;
  }
  uVar2 = *puVar7;
  if (uVar2 == 0) {
    iVar5 = 0x40;
  }
  else {
    lVar3 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
      }
    }
    iVar5 = (int)lVar3;
  }
  uVar4 = iVar5 - (int)lVar6;
LAB_0013bed7:
  if (uVar1 < uVar4) {
    uVar4 = uVar1;
  }
  return uVar4;
}

Assistant:

unsigned APInt::countTrailingZerosSlowCase() const {
  unsigned Count = 0;
  unsigned i = 0;
  for (; i < getNumWords() && U.pVal[i] == 0; ++i)
    Count += APINT_BITS_PER_WORD;
  if (i < getNumWords())
    Count += llvm::countTrailingZeros(U.pVal[i]);
  return std::min(Count, BitWidth);
}